

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O3

void __thiscall
rw::PluginList::assertRights(PluginList *this,void *object,uint32 pluginID,uint32 data)

{
  LLLink *pLVar1;
  
  pLVar1 = &(this->plugins).link;
  do {
    pLVar1 = ((LLLink *)&pLVar1->next)->next;
    if (pLVar1 == &(this->plugins).link) {
      return;
    }
  } while (*(uint32 *)&pLVar1[-5].next != pluginID);
  if (pLVar1[-2].prev == (LLLink *)0x0) {
    return;
  }
  (*(code *)pLVar1[-2].prev)
            (object,*(undefined4 *)&pLVar1[-6].prev,*(undefined4 *)((long)&pLVar1[-6].prev + 4));
  return;
}

Assistant:

void
PluginList::assertRights(void *object, uint32 pluginID, uint32 data)
{
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->id == pluginID){
			if(p->rightsCallback)
				p->rightsCallback(object,
				                  p->offset, p->size, data);
			return;
		}
	}
}